

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteSpherical.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkRevoluteSpherical::Initialize
          (ChLinkRevoluteSpherical *this,shared_ptr<chrono::ChBody> *body1,
          shared_ptr<chrono::ChBody> *body2,ChCoordsys<double> *csys,double distance)

{
  element_type *peVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ChBodyFrame *pCVar4;
  ChBodyFrame *pCVar5;
  ChVector<double> x_Axis;
  ChVector<double> z_axis;
  ChVector<double> v;
  ChVector<double> local_98;
  double local_78;
  double local_68;
  double dStack_60;
  double local_58;
  ChVector<double> local_50;
  ChVector<double> local_38;
  
  peVar1 = (body1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar5 = &peVar1->super_ChBodyFrame;
  if (peVar1 == (element_type *)0x0) {
    pCVar5 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body1 = pCVar5;
  peVar1 = (body2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar4 = &peVar1->super_ChBodyFrame;
  if (peVar1 == (element_type *)0x0) {
    pCVar4 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body2 = pCVar4;
  local_78 = distance;
  iVar2 = (*(pCVar5->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  iVar3 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dist,(ChVariables *)CONCAT44(extraout_var,iVar2),
             (ChVariables *)CONCAT44(extraout_var_00,iVar3));
  iVar2 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar3 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dot,(ChVariables *)CONCAT44(extraout_var_01,iVar2),
             (ChVariables *)CONCAT44(extraout_var_02,iVar3));
  ChQuaternion<double>::GetXaxis(&csys->rot);
  ChQuaternion<double>::GetZaxis(&csys->rot);
  ChFrame<double>::TransformPointParentToLocal
            (&local_98,(ChFrame<double> *)(this->super_ChLink).Body1,&csys->pos);
  if (&local_98 != &this->m_pos1) {
    (this->m_pos1).m_data[0] = local_98.m_data[0];
    (this->m_pos1).m_data[1] = local_98.m_data[1];
    (this->m_pos1).m_data[2] = local_98.m_data[2];
  }
  ChFrame<double>::TransformDirectionParentToLocal
            (&local_98,(ChFrame<double> *)(this->super_ChLink).Body1,&local_50);
  if (&local_98 != &this->m_dir1) {
    (this->m_dir1).m_data[0] = local_98.m_data[0];
    (this->m_dir1).m_data[1] = local_98.m_data[1];
    (this->m_dir1).m_data[2] = local_98.m_data[2];
  }
  local_38.m_data[0] = local_78 * local_68 + (csys->pos).m_data[0];
  local_38.m_data[1] = local_78 * dStack_60 + (csys->pos).m_data[1];
  local_38.m_data[2] = local_78 * local_58 + (csys->pos).m_data[2];
  ChFrame<double>::TransformPointParentToLocal
            (&local_98,(ChFrame<double> *)(this->super_ChLink).Body2,&local_38);
  if (&local_98 != &this->m_pos2) {
    (this->m_pos2).m_data[0] = local_98.m_data[0];
    (this->m_pos2).m_data[1] = local_98.m_data[1];
    (this->m_pos2).m_data[2] = local_98.m_data[2];
  }
  this->m_dist = local_78;
  this->m_cur_dist = local_78;
  this->m_cur_dot = 0.0;
  return;
}

Assistant:

void ChLinkRevoluteSpherical::Initialize(std::shared_ptr<ChBody> body1,
                                         std::shared_ptr<ChBody> body2,
                                         const ChCoordsys<>& csys,
                                         double distance) {
    Body1 = body1.get();
    Body2 = body2.get();

    m_cnstr_dist.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_dot.SetVariables(&Body1->Variables(), &Body2->Variables());

    ChVector<> x_Axis = csys.rot.GetXaxis();
    ChVector<> z_axis = csys.rot.GetZaxis();

    m_pos1 = Body1->TransformPointParentToLocal(csys.pos);
    m_dir1 = Body1->TransformDirectionParentToLocal(z_axis);
    m_pos2 = Body2->TransformPointParentToLocal(csys.pos + distance * x_Axis);

    m_dist = distance;
    m_cur_dist = distance;
    m_cur_dot = 0;
}